

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtoofft.c
# Opt level: O0

CURLofft curlx_strtoofft(char *str,char **endp,int base,curl_off_t *num)

{
  int *piVar1;
  long lVar2;
  bool bVar3;
  curl_off_t number;
  char *end;
  curl_off_t *num_local;
  char **ppcStack_20;
  int base_local;
  char **endp_local;
  char *str_local;
  
  end = (char *)num;
  num_local._4_4_ = base;
  ppcStack_20 = endp;
  endp_local = (char **)str;
  piVar1 = __errno_location();
  *piVar1 = 0;
  end[0] = '\0';
  end[1] = '\0';
  end[2] = '\0';
  end[3] = '\0';
  end[4] = '\0';
  end[5] = '\0';
  end[6] = '\0';
  end[7] = '\0';
  while( true ) {
    bVar3 = false;
    if ((*(char *)endp_local != '\0') && (bVar3 = true, *(char *)endp_local != ' ')) {
      bVar3 = *(char *)endp_local == '\t';
    }
    if (!bVar3) break;
    endp_local = (char **)((long)endp_local + 1);
  }
  if ((((*(char *)endp_local == '-') || (*(char *)endp_local == ' ')) ||
      (*(char *)endp_local == '\t')) ||
     (('\t' < *(char *)endp_local && (*(char *)endp_local < '\x0e')))) {
    if (ppcStack_20 != (char **)0x0) {
      *ppcStack_20 = (char *)endp_local;
    }
    str_local._4_4_ = CURL_OFFT_INVAL;
  }
  else {
    lVar2 = strtol((char *)endp_local,(char **)&number,num_local._4_4_);
    if (ppcStack_20 != (char **)0x0) {
      *ppcStack_20 = (char *)number;
    }
    piVar1 = __errno_location();
    if (*piVar1 == 0x22) {
      str_local._4_4_ = CURL_OFFT_FLOW;
    }
    else if (endp_local == (char **)number) {
      str_local._4_4_ = CURL_OFFT_INVAL;
    }
    else {
      *(long *)end = lVar2;
      str_local._4_4_ = CURL_OFFT_OK;
    }
  }
  return str_local._4_4_;
}

Assistant:

CURLofft curlx_strtoofft(const char *str, char **endp, int base,
                         curl_off_t *num)
{
  char *end;
  curl_off_t number;
  errno = 0;
  *num = 0; /* clear by default */

  while(*str && ISBLANK(*str))
    str++;
  if(('-' == *str) || (ISSPACE(*str))) {
    if(endp)
      *endp = (char *)str; /* didn't actually move */
    return CURL_OFFT_INVAL; /* nothing parsed */
  }
  number = strtooff(str, &end, base);
  if(endp)
    *endp = end;
  if(errno == ERANGE)
    /* overflow/underflow */
    return CURL_OFFT_FLOW;
  else if(str == end)
    /* nothing parsed */
    return CURL_OFFT_INVAL;

  *num = number;
  return CURL_OFFT_OK;
}